

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::TopKLayerParams::_InternalSerialize
          (TopKLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  int size;
  ulong uVar6;
  size_t __n;
  
  uVar5 = this->axis_;
  if (uVar5 != 0) {
    puVar3 = target;
    if (stream->end_ <= target) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar5 = this->axis_;
    }
    *puVar3 = '\b';
    puVar3[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      target = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar5 | 0x80;
      puVar3[2] = (uint8_t)(uVar5 >> 7);
      target = puVar3 + 3;
      if (0x3fff < uVar5) {
        uVar6 = (ulong)puVar3[2];
        uVar5 = uVar5 >> 7;
        do {
          target[-1] = (byte)uVar6 | 0x80;
          uVar4 = uVar5 >> 7;
          *target = (uint8_t)uVar4;
          target = target + 1;
          uVar6 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  uVar5 = this->k_;
  puVar3 = target;
  if (uVar5 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar5 = this->k_;
    }
    *target = '\x10';
    target[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      puVar3 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      target[2] = (uint8_t)(uVar5 >> 7);
      puVar3 = target + 3;
      if (0x3fff < uVar5) {
        uVar6 = (ulong)target[2];
        uVar5 = uVar5 >> 7;
        do {
          puVar3[-1] = (byte)uVar6 | 0x80;
          uVar4 = uVar5 >> 7;
          *puVar3 = (uint8_t)uVar4;
          puVar3 = puVar3 + 1;
          uVar6 = uVar4 & 0xffffffff;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
    }
  }
  if (this->usebottomk_ == true) {
    uVar2 = '\x01';
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
      uVar2 = this->usebottomk_;
    }
    *puVar3 = '\x18';
    puVar3[1] = uVar2;
    puVar3 = puVar3 + 2;
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    data = *(void **)(uVar5 + 8);
    size = (int)*(undefined8 *)(uVar5 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar3 < (long)__n) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar3);
      return puVar3;
    }
    memcpy(puVar3,data,__n);
    puVar3 = puVar3 + __n;
  }
  return puVar3;
}

Assistant:

uint8_t* TopKLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TopKLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->_internal_axis() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_axis(), target);
  }

  // uint64 K = 2;
  if (this->_internal_k() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_k(), target);
  }

  // bool useBottomK = 3;
  if (this->_internal_usebottomk() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_usebottomk(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TopKLayerParams)
  return target;
}